

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Degree_Generator.cc
# Opt level: O0

int __thiscall Degree_Generator::deg_generator(Degree_Generator *this,int v)

{
  ostream *this_00;
  int local_20;
  int deg;
  int index_d;
  int v_local;
  Degree_Generator *this_local;
  
  if ((v < 0x100000) && (-1 < v)) {
    for (local_20 = 1;
        (local_20 < 8 && (((uint)v < f_table[local_20 + -1] || (f_table[local_20] <= (uint)v))));
        local_20 = local_20 + 1) {
    }
    if (8 < local_20) {
      this_00 = std::operator<<((ostream *)&std::cerr,"Inconsistent table state");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    }
    this_local._4_4_ = d_table[local_20 + -1];
  }
  else {
    this_local._4_4_ = 0xffffffff;
  }
  return this_local._4_4_;
}

Assistant:

int Degree_Generator::deg_generator(int v)
{
	int index_d = 0;
	int deg = 0;
	// v is a non-negative integer that is less than 2^^20 = 1048576
	// please refer to rfc6330 5.3.5.2 degree generator
	if ((v >= 1048576) || (v < 0) )
	{
		return -1;
	}

	// choose the degree: lookup the f_tabole
	for(index_d = 1; index_d < 8; index_d++)
	{
		if((f_table[index_d - 1] <= v) && (v < f_table[index_d]))
		{
		     break;
		}
	}

	if (index_d > 8)
	{
		std::cerr << "Inconsistent table state" << std::endl;
	}

	deg = d_table[index_d - 1];

	return deg;

}